

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> cppurses::input::get(void)

{
  Area *__args_1;
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  Widget *this;
  size_t sVar4;
  size_t sVar5;
  tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_> in_RDI;
  long lVar6;
  _Base_bitset<1UL> _Var7;
  undefined4 uStackY_80;
  Code code;
  undefined6 uStack_76;
  int iStack_74;
  Glyph GStack_70;
  _func_int **local_58;
  size_t local_50;
  _Base_bitset<1UL> local_48;
  long local_40;
  long local_38;
  Code local_30;
  
  iVar2 = wgetch(_stdscr);
  __args_1 = System::head_;
  if (iVar2 == 0x19a) {
    if (System::head_ == (Area *)0x0) {
LAB_0015e56e:
      local_58 = (_func_int **)0x0;
    }
    else {
      pp_Var3 = (_func_int **)Terminal::width((Terminal *)System::terminal);
      local_50 = Terminal::height((Terminal *)System::terminal);
      local_58 = pp_Var3;
      std::make_unique<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>
                ((Widget *)&code,__args_1);
      local_58 = _code;
    }
LAB_0015e570:
    *(_func_int ***)
     in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
     super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = local_58;
  }
  else {
    if (iVar2 == 0x199) {
      _code = (_func_int **)0x0;
      GStack_70.symbol = L'\0';
      GStack_70._4_4_ = 0;
      GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w._0_4_ = 0;
      iVar2 = getmouse();
      if (iVar2 == 0) {
        this = detail::find_widget_at((long)iStack_74,(long)GStack_70.symbol);
        if (this != (Widget *)0x0) {
          lVar6 = (long)iStack_74;
          _Var7._M_w = (_WordT)GStack_70.symbol;
          sVar4 = Widget::inner_x(this);
          sVar5 = Widget::inner_y(this);
          local_38 = _Var7._M_w - sVar5;
          local_50 = lVar6;
          local_48._M_w = _Var7._M_w;
          local_40 = lVar6 - sVar4;
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w & 2) != 0) {
            uStackY_80 = 1;
LAB_0015e622:
            local_58 = (_func_int **)CONCAT44(local_58._4_4_,uStackY_80);
            local_30 = code;
            std::make_unique<cppurses::Mouse::Press,cppurses::Widget&,cppurses::Mouse::State>
                      ((Widget *)
                       in_RDI.
                       super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                       .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(State *)this);
            return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>
                    )(tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
                     in_RDI.
                     super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                     .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w & 1) != 0) {
            uStackY_80 = 1;
LAB_0015e654:
            local_58 = (_func_int **)CONCAT44(local_58._4_4_,uStackY_80);
            local_30 = code;
            std::make_unique<cppurses::Mouse::Release,cppurses::Widget&,cppurses::Mouse::State>
                      ((Widget *)
                       in_RDI.
                       super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                       .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(State *)this);
            return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>
                    )(__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>
                      )in_RDI.
                       super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                       .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w & 0x40) != 0) {
            uStackY_80 = 2;
            goto LAB_0015e622;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w & 0x20) != 0) {
            uStackY_80 = 2;
            goto LAB_0015e654;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w >> 0xb & 1) != 0) {
            uStackY_80 = 3;
            goto LAB_0015e622;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w >> 10 & 1) != 0) {
            uStackY_80 = 3;
            goto LAB_0015e654;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w >> 0x10 & 1) != 0) {
            uStackY_80 = 4;
            goto LAB_0015e622;
          }
          if ((short)(uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w < 0) {
            uStackY_80 = 4;
            goto LAB_0015e654;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w >> 0x15 & 1) != 0) {
            uStackY_80 = 5;
            goto LAB_0015e622;
          }
          if (((uint)GStack_70.brush.attributes_.super__Base_bitset<1UL>._M_w >> 0x14 & 1) != 0) {
            uStackY_80 = 5;
            goto LAB_0015e654;
          }
        }
      }
    }
    else if (iVar2 != -1) {
      _code = (_func_int **)CONCAT62(uStack_76,(short)iVar2);
      bVar1 = Shortcuts::send_key(Null);
      if ((bVar1) || (Focus::focus_widget_ == (Code *)0x0)) goto LAB_0015e56e;
      std::make_unique<cppurses::Key::Press,cppurses::Widget&,cppurses::Key::Code_const&>
                ((Widget *)&stack0xffffffffffffffa8,Focus::focus_widget_);
      goto LAB_0015e570;
    }
    *(undefined8 *)
     in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
     super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = 0;
  }
  return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
         (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
         in_RDI.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
         super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
}

Assistant:

auto get() -> std::unique_ptr<Event>
{
    const auto input = ::getch();
    switch (input) {
        case ERR: return nullptr;  // Timeout and no event.
        case KEY_MOUSE: return make_mouse_event();
        case KEY_RESIZE: return make_resize_event();
        default: return make_keyboard_event(input);  // Key_event
    }
}